

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

bool __thiscall
TcpSocketImpl::Connect(TcpSocketImpl *this,char *szIpToWhere,uint16_t sPort,int AddrHint)

{
  BaseSocket *pBVar1;
  char *__name;
  bool bVar2;
  int iVar3;
  char *__service;
  int *piVar4;
  int *piVar5;
  TcpSocket *local_160;
  int iSocketErr;
  TcpSocket *pTcpSocket;
  code *local_f8;
  undefined8 local_f0;
  thread local_e8;
  TcpSocketImpl *local_e0;
  code *local_d8;
  undefined8 local_d0;
  thread local_c8;
  TcpSocketImpl *local_c0;
  code *local_b8;
  undefined8 local_b0;
  thread local_a8;
  int local_a0;
  undefined4 local_9c;
  int rc;
  uint32_t on;
  bool bRet;
  string local_88;
  undefined1 auStack_68 [8];
  addrinfo hint;
  addrinfo *local_30;
  addrinfo *lstAddr;
  int AddrHint_local;
  uint16_t sPort_local;
  char *szIpToWhere_local;
  TcpSocketImpl *this_local;
  
  lstAddr._0_4_ = AddrHint;
  lstAddr._6_2_ = sPort;
  _AddrHint_local = szIpToWhere;
  szIpToWhere_local = (char *)this;
  if ((this->super_BaseSocketImpl).m_fSock != -1) {
    close((this->super_BaseSocketImpl).m_fSock);
    (this->super_BaseSocketImpl).m_fSock = -1;
  }
  __name = _AddrHint_local;
  local_30 = (addrinfo *)0x0;
  hint.ai_addr = (sockaddr *)0x0;
  hint.ai_canonname = (char *)0x0;
  hint.ai_socktype = 0;
  hint.ai_protocol = 0;
  hint.ai_addrlen = 0;
  hint._20_4_ = 0;
  auStack_68 = (undefined1  [8])((ulong)(uint)lstAddr << 0x20);
  hint.ai_flags = 1;
  hint.ai_family = 0;
  std::__cxx11::to_string(&local_88,(uint)lstAddr._6_2_);
  __service = (char *)std::__cxx11::string::c_str();
  iVar3 = getaddrinfo(__name,__service,(addrinfo *)auStack_68,&local_30);
  std::__cxx11::string::~string((string *)&local_88);
  if (iVar3 == 0) {
    rc._3_1_ = 1;
    iVar3 = socket(local_30->ai_family,local_30->ai_socktype,local_30->ai_protocol);
    (this->super_BaseSocketImpl).m_fSock = iVar3;
    if ((this->super_BaseSocketImpl).m_fSock == -1) {
      piVar4 = (int *)__cxa_allocate_exception(4);
      piVar5 = __errno_location();
      *piVar4 = *piVar5;
      __cxa_throw(piVar4,&int::typeinfo,0);
    }
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])
              (this,&(this->super_BaseSocketImpl).m_fSock);
    if (local_30->ai_family == 10) {
      local_9c = 0;
      iVar3 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x1a,&local_9c,4);
      if (iVar3 == -1) {
        piVar4 = (int *)__cxa_allocate_exception(4);
        piVar5 = __errno_location();
        *piVar4 = *piVar5;
        __cxa_throw(piVar4,&int::typeinfo,0);
      }
    }
    local_a0 = connect((this->super_BaseSocketImpl).m_fSock,local_30->ai_addr,local_30->ai_addrlen);
    if (local_a0 == -1) {
      piVar4 = __errno_location();
      (this->super_BaseSocketImpl).m_iError = *piVar4;
      if ((this->super_BaseSocketImpl).m_iError != 0x73) {
        piVar4 = (int *)__cxa_allocate_exception(4);
        *piVar4 = (this->super_BaseSocketImpl).m_iError;
        __cxa_throw(piVar4,&int::typeinfo,0);
      }
      (this->super_BaseSocketImpl).m_iError = 0;
      local_b8 = ConnectThread;
      local_b0 = 0;
      local_c0 = this;
      std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
                (&local_a8,(type *)&local_b8,&local_c0);
      std::thread::operator=(&this->m_thConnect,&local_a8);
      std::thread::~thread(&local_a8);
    }
    else {
      GetConnectionInfo(this);
      local_d8 = SelectThread;
      local_d0 = 0;
      local_e0 = this;
      std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
                (&local_c8,(type *)&local_d8,&local_e0);
      std::thread::operator=(&(this->super_BaseSocketImpl).m_thListen,&local_c8);
      std::thread::~thread(&local_c8);
      local_f8 = WriteThread;
      local_f0 = 0;
      pTcpSocket = (TcpSocket *)this;
      std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
                (&local_e8,(type *)&local_f8,(TcpSocketImpl **)&pTcpSocket);
      std::thread::operator=(&(this->super_BaseSocketImpl).m_thWrite,&local_e8);
      std::thread::~thread(&local_e8);
      pBVar1 = (this->super_BaseSocketImpl).m_pBkRef;
      if (pBVar1 == (BaseSocket *)0x0) {
        local_160 = (TcpSocket *)0x0;
      }
      else {
        local_160 = (TcpSocket *)__dynamic_cast(pBVar1,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0)
        ;
      }
      bVar2 = std::function::operator_cast_to_bool((function *)&this->m_fClientConnectedParam);
      if ((bVar2) && (local_160 != (TcpSocket *)0x0)) {
        std::function<void_(TcpSocket_*,_void_*)>::operator()
                  (&this->m_fClientConnectedParam,local_160,
                   (this->super_BaseSocketImpl).m_pvUserData);
      }
      else {
        bVar2 = std::function::operator_cast_to_bool((function *)&this->m_fClientConnected);
        if ((bVar2) && (local_160 != (TcpSocket *)0x0)) {
          std::function<void_(TcpSocket_*)>::operator()(&this->m_fClientConnected,local_160);
        }
      }
      bVar2 = std::function::operator_cast_to_bool((function *)&this->m_fClientConnectedSsl);
      if (bVar2) {
        std::function<void_(TcpSocketImpl_*)>::operator()
                  (&this->m_fClientConnectedSsl,(TcpSocketImpl *)0x0);
      }
    }
    freeaddrinfo(local_30);
    this_local._7_1_ = (bool)(rc._3_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TcpSocketImpl::Connect(const char* const szIpToWhere, const uint16_t sPort, const int AddrHint/* = AF_UNSPEC*/)
{
    if (m_fSock != INVALID_SOCKET)
    {
        ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;
    }

    struct addrinfo* lstAddr{}, hint{};
    hint.ai_family = AddrHint;
    hint.ai_socktype = SOCK_STREAM;

    if (::getaddrinfo(szIpToWhere, to_string(sPort).c_str(), &hint, &lstAddr) != 0)
        return false;

    bool bRet = true;

    try
    {
        m_fSock = ::socket(lstAddr->ai_family, lstAddr->ai_socktype, lstAddr->ai_protocol);
        if (m_fSock == INVALID_SOCKET)
            throw WSAGetLastError();

        SetSocketOption(m_fSock);

        if (lstAddr->ai_family == AF_INET6)
        {
            constexpr uint32_t on = 0;
            if (::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_V6ONLY, reinterpret_cast<const char*>(&on), sizeof(on)) == -1)
                throw WSAGetLastError();
        }

        const int rc = ::connect(m_fSock, lstAddr->ai_addr, static_cast<int>(lstAddr->ai_addrlen));
        if (rc == SOCKET_ERROR)
        {
            m_iError = WSAGetLastError();
#if defined (_WIN32) || defined (_WIN64)
            if (m_iError != WSAEWOULDBLOCK)
#else
            if (m_iError != EINPROGRESS)
#endif
                throw m_iError;

            m_iError = 0;
            m_thConnect = thread(&TcpSocketImpl::ConnectThread, this);
        }
        else
        {
            GetConnectionInfo();

            m_thListen = thread(&TcpSocketImpl::SelectThread, this);
            m_thWrite = thread(&TcpSocketImpl::WriteThread, this);

            TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
            if (m_fClientConnectedParam && pTcpSocket != nullptr)
                m_fClientConnectedParam(pTcpSocket, m_pvUserData);
            else if (m_fClientConnected && pTcpSocket != nullptr)
                m_fClientConnected(pTcpSocket);

            if (m_fClientConnectedSsl)
                m_fClientConnectedSsl(nullptr);
        }
    }

    catch (const int iSocketErr)
    {
        m_iError = iSocketErr;
        m_iErrLoc = 1;

        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }
        bRet = false;
    }

    ::freeaddrinfo(lstAddr);

    return bRet;
}